

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O3

Orphan<capnp::Text> * __thiscall
capnp::_::anon_unknown_0::PrefixAdder::decode
          (Orphan<capnp::Text> *__return_storage_ptr__,PrefixAdder *this,JsonCodec *codec,
          Reader input,Orphanage orphanage)

{
  bool bVar1;
  PointerReader local_48;
  
  bVar1 = input._reader.pointerCount == 0;
  local_48.pointer = input._reader.pointers;
  if (bVar1) {
    local_48.pointer = (WirePointer *)0x0;
  }
  local_48.nestingLimit = 0x7fffffff;
  if (!bVar1) {
    local_48.nestingLimit = input._reader.nestingLimit;
  }
  local_48.segment._0_4_ = 0;
  local_48.segment._4_4_ = 0;
  local_48.capTable._0_4_ = 0;
  local_48.capTable._4_4_ = 0;
  if (!bVar1) {
    local_48.segment._0_4_ = input._reader.segment._0_4_;
    local_48.segment._4_4_ = input._reader.segment._4_4_;
    local_48.capTable._0_4_ = input._reader.capTable._0_4_;
    local_48.capTable._4_4_ = input._reader.capTable._4_4_;
  }
  PointerReader::getBlob<capnp::Text>(&local_48,(void *)0x0,0);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)orphanage.arena);
  (__return_storage_ptr__->builder).segment =
       (SegmentBuilder *)CONCAT44(local_48.capTable._4_4_,local_48.capTable._0_4_);
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_48.pointer;
  (__return_storage_ptr__->builder).location =
       (word *)CONCAT44(local_48._28_4_,local_48.nestingLimit);
  (__return_storage_ptr__->builder).tag.content =
       CONCAT44(local_48.segment._4_4_,local_48.segment._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Orphan<capnp::Text> decode(const JsonCodec& codec, JsonValue::Reader input,
                             Orphanage orphanage) const override {
    return orphanage.newOrphanCopy(capnp::Text::Reader(input.getString().slice(11)));
  }